

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O0

size_t xmi_process_chunks(PBuffer *buffer,MidiFile *midi)

{
  element_type *peVar1;
  size_t sVar2;
  element_type *peVar3;
  undefined1 local_58 [48];
  element_type *local_28;
  size_t size;
  size_t length;
  MidiFile *midi_local;
  PBuffer *buffer_local;
  
  length = (size_t)midi;
  midi_local = (MidiFile *)buffer;
  peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  size = Buffer::get_size(peVar1);
  while( true ) {
    peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        buffer);
    sVar2 = Buffer::get_size(peVar1);
    if (sVar2 == 0) break;
    std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)(local_58 + 0x20),buffer);
    peVar3 = (element_type *)
             xmi_process_chunk((shared_ptr<Buffer> *)(local_58 + 0x20),(MidiFile *)length);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)(local_58 + 0x20));
    local_28 = peVar3;
    peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        buffer);
    Buffer::get_tail((Buffer *)local_58,(size_t)peVar1);
    std::shared_ptr<Buffer>::operator=(buffer,(shared_ptr<Buffer> *)local_58);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_58);
  }
  return size;
}

Assistant:

static size_t
xmi_process_chunks(PBuffer buffer, MidiFile *midi) {
  size_t length = buffer->get_size();

  while (buffer->get_size()) {
    size_t size = xmi_process_chunk(buffer, midi);
    buffer = buffer->get_tail(size);
  }

  return length;
}